

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDA.hpp
# Opt level: O3

void __thiscall
PCCompatible::MDA::CRTCOutputter::perform_bus_cycle_phase1(CRTCOutputter *this,BusState *state)

{
  byte bVar1;
  OutputState OVar2;
  uint uVar3;
  ScanTarget *pSVar4;
  long *plVar5;
  uint8_t *puVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  OutputState OVar10;
  uint uVar11;
  int iVar12;
  byte bVar13;
  byte bVar14;
  undefined4 extraout_var;
  
  OVar10 = Sync;
  if (state->vsync == false && state->hsync == false) {
    OVar10 = Border;
    if (state->display_enable != false) {
      OVar10 = ((this->control_ & 8) == 0) + Pixels;
    }
  }
  OVar2 = this->output_state;
  iVar12 = this->count;
  if (0x372 < iVar12 || OVar10 != OVar2) {
    if (iVar12 != 0) {
      if (OVar2 == Border) {
        Outputs::CRT::CRT::output_blank(&this->crt,iVar12);
      }
      else if (OVar2 == Pixels) {
        Outputs::CRT::CRT::output_data(&this->crt,iVar12,(long)iVar12);
        this->pixels = (uint8_t *)0x0;
        this->pixel_pointer = (uint8_t *)0x0;
      }
      else if (OVar2 == Sync) {
        Outputs::CRT::CRT::output_sync(&this->crt,iVar12);
      }
    }
    this->output_state = OVar10;
    this->count = 0;
    iVar12 = 0;
  }
  if (OVar10 != Pixels) goto LAB_00383660;
  if (this->pixels == (uint8_t *)0x0) {
    pSVar4 = (this->crt).scan_target_;
    iVar12 = (*pSVar4->_vptr_ScanTarget[5])(pSVar4,0x2d0,1);
    puVar6 = (uint8_t *)CONCAT44(extraout_var,iVar12);
    (this->crt).allocated_data_length_ = -(ulong)(puVar6 == (uint8_t *)0x0) | 0x2d0;
    this->pixels = puVar6;
    this->pixel_pointer = puVar6;
    iVar12 = this->count;
    if (puVar6 == (uint8_t *)0x0) goto LAB_00383660;
    if (iVar12 != 0) {
      Outputs::CRT::CRT::output_blank(&this->crt,iVar12);
      this->count = 0;
      if (this->pixels == (uint8_t *)0x0) {
        iVar12 = 0;
        goto LAB_00383660;
      }
    }
  }
  if (state->cursor == true) {
    this->pixel_pointer[8] = '\t';
    this->pixel_pointer[7] = '\t';
    this->pixel_pointer[6] = '\t';
    this->pixel_pointer[5] = '\t';
    this->pixel_pointer[4] = '\t';
    this->pixel_pointer[3] = '\t';
    this->pixel_pointer[2] = '\t';
    this->pixel_pointer[1] = '\t';
    *this->pixel_pointer = '\t';
  }
  else {
    uVar3._0_2_ = state->refresh_address;
    uVar3._2_2_ = state->row_address;
    bVar14 = this->ram[(ulong)(uVar3 & 0x7ff) * 2 + 1];
    uVar11 = (uint)bVar14;
    bVar1 = this->ram[(ulong)(uVar3 & 0x7ff) * 2];
    bVar13 = (this->font).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start
             [(ulong)state->row_address + (ulong)bVar1 * 0x10 + (ulong)bVar1 * -2];
    bVar9 = (char)((uVar11 & 8) >> 3) << 2 | 9;
    bVar7 = 0;
    bVar8 = 0;
    if (bVar14 < 0x80) {
      if (uVar11 == 0x6f || bVar14 < 0x6f) {
        if ((uVar11 == 0) || (uVar11 == 8)) {
LAB_00383518:
          bVar13 = 0;
          bVar7 = 0;
        }
      }
      else if ((uVar11 == 0x70) || (bVar7 = bVar8, uVar11 == 0x78)) {
LAB_0038353a:
        bVar13 = ~bVar13;
        bVar7 = bVar9;
      }
    }
    else if (uVar11 < 0xf0) {
      if ((uVar11 == 0x80) || (bVar7 = bVar8, uVar11 == 0x88)) goto LAB_00383518;
    }
    else if ((uVar11 == 0xf0) || (bVar7 = bVar8, uVar11 == 0xf8)) goto LAB_0038353a;
    bVar8 = bVar7;
    if ((((char)bVar14 < '\0') && ((this->control_ & 0x20) != 0)) &&
       ((state->field_count & 0x10) != 0)) {
      bVar13 = ~bVar13;
      bVar8 = bVar9;
      if (bVar7 != 0) {
        bVar8 = 0;
      }
    }
    if (state->row_address == 0xd && (uVar11 & 7) == 1) {
      plVar5 = (long *)this->pixel_pointer;
      *plVar5 = (ulong)bVar9 * 0x101010101010101;
      *(char *)(plVar5 + 1) = (char)((ulong)bVar9 * 0x101010101010101);
    }
    else {
      *this->pixel_pointer = (char)bVar13 >> 7 & bVar9;
      bVar14 = bVar13 & 0x40;
      if ((bVar13 & 0x40) != 0) {
        bVar14 = bVar9;
      }
      this->pixel_pointer[1] = bVar14;
      bVar14 = bVar13 & 0x20;
      if ((bVar13 & 0x20) != 0) {
        bVar14 = bVar9;
      }
      this->pixel_pointer[2] = bVar14;
      bVar14 = bVar13 & 0x10;
      if ((bVar13 & 0x10) != 0) {
        bVar14 = bVar9;
      }
      this->pixel_pointer[3] = bVar14;
      bVar14 = bVar13 & 8;
      if ((bVar13 & 8) != 0) {
        bVar14 = bVar9;
      }
      this->pixel_pointer[4] = bVar14;
      bVar14 = bVar13 & 4;
      if ((bVar13 & 4) != 0) {
        bVar14 = bVar9;
      }
      this->pixel_pointer[5] = bVar14;
      bVar14 = bVar13 & 2;
      if ((bVar13 & 2) != 0) {
        bVar14 = bVar9;
      }
      this->pixel_pointer[6] = bVar14;
      bVar14 = bVar13 & 1;
      if ((bVar13 & 1) != 0) {
        bVar14 = bVar9;
      }
      this->pixel_pointer[7] = bVar14;
      if ((bVar1 & 0xe0) == 0xc0) {
        bVar8 = this->pixel_pointer[7];
      }
      this->pixel_pointer[8] = bVar8;
    }
  }
  this->pixel_pointer = this->pixel_pointer + 9;
  iVar12 = this->count;
LAB_00383660:
  iVar12 = iVar12 + 9;
  this->count = iVar12;
  if ((this->output_state == Pixels) && (this->pixel_pointer == this->pixels + 0x2d0)) {
    Outputs::CRT::CRT::output_data(&this->crt,iVar12,(long)iVar12);
    *(undefined8 *)&this->count = 0;
    *(undefined8 *)((long)&this->pixels + 4) = 0;
    *(undefined4 *)((long)&this->pixel_pointer + 4) = 0;
  }
  return;
}

Assistant:

void perform_bus_cycle_phase1(const Motorola::CRTC::BusState &state) {
				// Determine new output state.
				const OutputState new_state =
					(state.hsync | state.vsync) ? OutputState::Sync :
						((state.display_enable && control_&0x08) ? OutputState::Pixels : OutputState::Border);

				// Upon either a state change or just having accumulated too much local time...
				if(new_state != output_state || count > 882) {
					// (1) flush preexisting state.
					if(count) {
						switch(output_state) {
							case OutputState::Sync:		crt.output_sync(count);		break;
							case OutputState::Border: 	crt.output_blank(count);	break;
							case OutputState::Pixels:
								crt.output_data(count);
								pixels = pixel_pointer = nullptr;
							break;
						}
					}

					// (2) adopt new state.
					output_state = new_state;
					count = 0;
				}

				// Collect pixels if applicable.
				if(output_state == OutputState::Pixels) {
					if(!pixels) {
						pixel_pointer = pixels = crt.begin_data(DefaultAllocationSize);

						// Flush any period where pixels weren't recorded due to back pressure.
						if(pixels && count) {
							crt.output_blank(count);
							count = 0;
						}
					}

					if(pixels) {
						static constexpr uint8_t high_intensity = 0x0d;
						static constexpr uint8_t low_intensity = 0x09;
						static constexpr uint8_t off = 0x00;

						if(state.cursor) {
							pixel_pointer[0] =	pixel_pointer[1] =	pixel_pointer[2] =	pixel_pointer[3] =
							pixel_pointer[4] =	pixel_pointer[5] =	pixel_pointer[6] =	pixel_pointer[7] =
							pixel_pointer[8] =	low_intensity;
						} else {
							const uint8_t attributes = ram[((state.refresh_address << 1) + 1) & 0xfff];
							const uint8_t glyph = ram[((state.refresh_address << 1) + 0) & 0xfff];
							uint8_t row = font[(glyph * 14) + state.row_address];

							const uint8_t intensity = (attributes & 0x08) ? high_intensity : low_intensity;
							uint8_t blank = off;

							// Handle irregular attributes.
							// Cf. http://www.seasip.info/VintagePC/mda.html#memmap
							switch(attributes) {
								case 0x00:	case 0x08:	case 0x80:	case 0x88:
									row = 0;
								break;
								case 0x70:	case 0x78:	case 0xf0:	case 0xf8:
									row ^= 0xff;
									blank = intensity;
								break;
							}

							// Apply blink if enabled.
							if((control_ & 0x20) && (attributes & 0x80) && (state.field_count & 16)) {
								row ^= 0xff;
								blank = (blank == off) ? intensity : off;
							}

							if(((attributes & 7) == 1) && state.row_address == 13) {
								// Draw as underline.
								std::fill(pixel_pointer, pixel_pointer + 9, intensity);
							} else {
								// Draw according to ROM contents, possibly duplicating final column.
								pixel_pointer[0] = (row & 0x80) ? intensity : off;
								pixel_pointer[1] = (row & 0x40) ? intensity : off;
								pixel_pointer[2] = (row & 0x20) ? intensity : off;
								pixel_pointer[3] = (row & 0x10) ? intensity : off;
								pixel_pointer[4] = (row & 0x08) ? intensity : off;
								pixel_pointer[5] = (row & 0x04) ? intensity : off;
								pixel_pointer[6] = (row & 0x02) ? intensity : off;
								pixel_pointer[7] = (row & 0x01) ? intensity : off;
								pixel_pointer[8] = (glyph >= 0xc0 && glyph < 0xe0) ? pixel_pointer[7] : blank;
							}
						}
						pixel_pointer += 9;
					}
				}

				// Advance.
				count += 9;

				// Output pixel row prematurely if storage is exhausted.
				if(output_state == OutputState::Pixels && pixel_pointer == pixels + DefaultAllocationSize) {
					crt.output_data(count);
					count = 0;

					pixels = pixel_pointer = nullptr;
				}
			}